

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O2

char * findlocal(lua_State *L,CallInfo *ci,int n)

{
  int pc;
  Proto *f;
  char *pcVar1;
  StkId *ppTVar2;
  
  f = getluaproto(ci);
  if (f != (Proto *)0x0) {
    pc = currentpc(L,ci);
    pcVar1 = luaF_getlocalname(f,n,pc);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
  }
  ppTVar2 = &ci[1].func;
  if (L->ci == ci) {
    ppTVar2 = &L->top;
  }
  pcVar1 = "(*temporary)";
  if ((long)*ppTVar2 - (long)ci->base >> 4 < (long)n) {
    pcVar1 = (char *)0x0;
  }
  if (n < 1) {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n) {
  const char *name;
  Proto *fp = getluaproto(ci);
  if (fp && (name = luaF_getlocalname(fp, n, currentpc(L, ci))) != NULL)
    return name;  /* is a local variable in a Lua function */
  else {
    StkId limit = (ci == L->ci) ? L->top : (ci+1)->func;
    if (limit - ci->base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      return "(*temporary)";
    else
      return NULL;
  }
}